

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O2

void array_sum_bang(t_array_rangeop *x)

{
  float f;
  int iVar1;
  bool bVar2;
  int nitem;
  int stride;
  char *firstitem;
  int arrayonset;
  int local_20;
  int local_1c;
  float *local_18;
  int local_c;
  
  iVar1 = array_rangeop_getrange(x,(char **)&local_18,&local_20,&local_1c,&local_c);
  if (iVar1 != 0) {
    iVar1 = 0;
    if (0 < local_20) {
      iVar1 = local_20;
    }
    f = 0.0;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      f = f + *local_18;
      local_18 = (float *)((long)local_18 + (long)local_1c);
    }
    outlet_float((x->x_tc).tc_obj.te_outlet,f);
    return;
  }
  return;
}

Assistant:

static void array_sum_bang(t_array_rangeop *x)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    double sum;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    for (i = 0, sum = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        sum += *(t_float *)itemp;
    outlet_float(x->x_outlet, sum);
}